

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

void zlib_match(LZ77Context *ectx,int distance,int len)

{
  int iVar1;
  Outbuf *out;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  out = (Outbuf *)ectx->userdata;
LAB_00128312:
  if (len < 1) {
    return;
  }
  uVar5 = len - 3;
  if ((uint)len < 0x103) {
    uVar5 = len;
  }
  if (0x104 < (uint)len) {
    uVar5 = 0x102;
  }
  len = len - uVar5;
  uVar4 = 0x1d;
  uVar6 = 0xffffffff;
  do {
    iVar3 = (int)uVar4;
    while( true ) {
      if (iVar3 + -1 <= (int)uVar6) {
        __assert_fail("j - i >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c"
                      ,0x1fe,"void zlib_match(struct LZ77Context *, int, int)");
      }
      uVar4 = (long)((int)uVar6 + iVar3) / 2;
      iVar2 = (int)uVar4;
      iVar1 = lencodes[iVar2].min;
      if ((int)uVar5 < iVar1) break;
      uVar6 = uVar4 & 0xffffffff;
      if ((int)uVar5 <= lencodes[iVar2].max) {
        iVar3 = (int)lencodes[iVar2].code;
        uVar4 = (long)iVar3 * 2 - 0x200;
        if (0x117 < iVar3) {
          uVar4 = (ulong)(iVar3 - 0x58);
        }
        outbits(out,(ulong)""[uVar4],(0x117 < iVar3) + 7);
        if (lencodes[iVar2].extrabits != 0) {
          outbits(out,(long)(int)(uVar5 - iVar1),(int)lencodes[iVar2].extrabits);
        }
        uVar4 = 0x1e;
        uVar6 = 0xffffffff;
        goto LAB_001283df;
      }
    }
  } while( true );
  while (uVar6 = uVar4 & 0xffffffff, distcodes[iVar2].max < distance) {
    while( true ) {
      if (iVar3 + -1 <= (int)uVar6) {
        __assert_fail("j - i >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c"
                      ,0x222,"void zlib_match(struct LZ77Context *, int, int)");
      }
      uVar4 = (long)((int)uVar6 + iVar3) / 2;
      iVar2 = (int)uVar4;
      iVar1 = distcodes[iVar2].min;
      if (iVar1 <= distance) break;
LAB_001283df:
      iVar3 = (int)uVar4;
    }
  }
  outbits(out,(ulong)""[(long)distcodes[iVar2].code * 8],5);
  if (distcodes[iVar2].extrabits != 0) {
    outbits(out,(long)(distance - iVar1),(int)distcodes[iVar2].extrabits);
  }
  goto LAB_00128312;
}

Assistant:

static void zlib_match(struct LZ77Context *ectx, int distance, int len)
{
    const coderecord *d, *l;
    int i, j, k;
    struct Outbuf *out = (struct Outbuf *) ectx->userdata;

    while (len > 0) {
        int thislen;

        /*
         * We can transmit matches of lengths 3 through 258
         * inclusive. So if len exceeds 258, we must transmit in
         * several steps, with 258 or less in each step.
         *
         * Specifically: if len >= 261, we can transmit 258 and be
         * sure of having at least 3 left for the next step. And if
         * len <= 258, we can just transmit len. But if len == 259
         * or 260, we must transmit len-3.
         */
        thislen = (len > 260 ? 258 : len <= 258 ? len : len - 3);
        len -= thislen;

        /*
         * Binary-search to find which length code we're
         * transmitting.
         */
        i = -1;
        j = lenof(lencodes);
        while (1) {
            assert(j - i >= 2);
            k = (j + i) / 2;
            if (thislen < lencodes[k].min)
                j = k;
            else if (thislen > lencodes[k].max)
                i = k;
            else {
                l = &lencodes[k];
                break;                 /* found it! */
            }
        }

        /*
         * Transmit the length code. 256-279 are seven bits
         * starting at 0000000; 280-287 are eight bits starting at
         * 11000000.
         */
        if (l->code <= 279) {
            outbits(out, mirrorbytes[(l->code - 256) * 2], 7);
        } else {
            outbits(out, mirrorbytes[0xc0 - 280 + l->code], 8);
        }

        /*
         * Transmit the extra bits.
         */
        if (l->extrabits)
            outbits(out, thislen - l->min, l->extrabits);

        /*
         * Binary-search to find which distance code we're
         * transmitting.
         */
        i = -1;
        j = lenof(distcodes);
        while (1) {
            assert(j - i >= 2);
            k = (j + i) / 2;
            if (distance < distcodes[k].min)
                j = k;
            else if (distance > distcodes[k].max)
                i = k;
            else {
                d = &distcodes[k];
                break;                 /* found it! */
            }
        }

        /*
         * Transmit the distance code. Five bits starting at 00000.
         */
        outbits(out, mirrorbytes[d->code * 8], 5);

        /*
         * Transmit the extra bits.
         */
        if (d->extrabits)
            outbits(out, distance - d->min, d->extrabits);
    }
}